

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

int __thiscall
CVmObjIterLookupTable::getp_get_cur_key
          (CVmObjIterLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  undefined4 in_register_00000034;
  
  if (getp_get_cur_key(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_get_cur_key(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_get_cur_key::desc.min_argc_ = 0;
      getp_get_cur_key::desc.opt_argc_ = 0;
      getp_get_cur_key::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_cur_key(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_cur_key::desc);
  if (iVar1 == 0) {
    get_cur_entry(this,(vm_val_t *)0x0,retval);
  }
  return 1;
}

Assistant:

int CVmObjIterLookupTable::getp_get_cur_key(VMG_ vm_obj_id_t self,
                                            vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the entry's key */
    get_cur_entry(vmg_ 0, retval);

    /* handled */
    return TRUE;
}